

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# creation_set.c
# Opt level: O3

int cset_auto_compress(creation_set *cset,char *filename)

{
  undefined8 *puVar1;
  filter_set *__ptr;
  int iVar2;
  char *pcVar3;
  char *suffix;
  char *pcVar4;
  size_t sVar5;
  filter_set *pfVar6;
  filter_set *pfVar7;
  size_t sVar8;
  
  pcVar3 = strdup(filename);
  if (pcVar3 == (char *)0x0) {
LAB_0010d349:
    lafe_errc(1,0,"No memory");
  }
  pfVar6 = cset->filters;
  iVar2 = cset->filter_count;
  cset->filters = (filter_set *)0x0;
  cset->filter_count = 0;
  suffix = strrchr(pcVar3,0x2e);
  while (suffix != (char *)0x0) {
    while (pcVar4 = get_suffix_code((suffix_code_t *)get_filter_code_filters,suffix),
          pcVar4 != (char *)0x0) {
      _cset_add_filter(cset,0,pcVar4);
      *suffix = '\0';
      suffix = strrchr(pcVar3,0x2e);
      if (suffix == (char *)0x0) goto LAB_0010d2cb;
    }
    pcVar4 = get_suffix_code((suffix_code_t *)get_format_code_formats,suffix);
    if (pcVar4 != (char *)0x0) {
      cset_set_format(cset,pcVar4);
      break;
    }
    pcVar4 = get_suffix_code((suffix_code_t *)decompose_alias_alias,suffix);
    if (pcVar4 == (char *)0x0) break;
    *suffix = '\0';
    sVar8 = strlen(pcVar3);
    sVar5 = strlen(pcVar4);
    pcVar3 = (char *)realloc(pcVar3,sVar5 + sVar8 + 1);
    if (pcVar3 == (char *)0x0) goto LAB_0010d349;
    strcat(pcVar3,pcVar4);
    suffix = strrchr(pcVar3,0x2e);
  }
LAB_0010d2cb:
  free(pcVar3);
  if (cset->filters == (filter_set *)0x0) {
    cset->filters = pfVar6;
    cset->filter_count = iVar2;
    iVar2 = 0;
  }
  else {
    _cleanup_filters(pfVar6,iVar2);
    iVar2 = cset->filter_count;
    sVar8 = (long)iVar2 << 4;
    pfVar6 = (filter_set *)malloc(sVar8);
    if (pfVar6 == (filter_set *)0x0) goto LAB_0010d349;
    __ptr = cset->filters;
    pfVar7 = pfVar6;
    if (0 < iVar2) {
      do {
        puVar1 = (undefined8 *)((long)&__ptr[-1].program + sVar8);
        pcVar3 = (char *)puVar1[1];
        *(undefined8 *)pfVar7 = *puVar1;
        pfVar7->filter_name = pcVar3;
        sVar8 = sVar8 - 0x10;
        pfVar7 = pfVar7 + 1;
      } while (sVar8 != 0);
    }
    free(__ptr);
    cset->filters = pfVar6;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int
cset_auto_compress(struct creation_set *cset, const char *filename)
{
	struct filter_set *old_filters;
	char *name, *p;
	const char *code;
	int old_filter_count;

	name = strdup(filename);
	if (name == NULL)
		lafe_errc(1, 0, "No memory");
	/* Save previous filters. */
	old_filters = cset->filters;
	old_filter_count = cset->filter_count;
	cset->filters = NULL;
	cset->filter_count = 0;

	for (;;) {
		/* Get the suffix. */
		p = strrchr(name, '.');
		if (p == NULL)
			break;
		/* Suppose it indicates compression/filter type
		 * such as ".gz". */
		code = get_filter_code(p);
		if (code != NULL) {
			cset_add_filter(cset, code);
			*p = '\0';
			continue;
		}
		/* Suppose it indicates format type such as ".tar". */
		code = get_format_code(p);
		if (code != NULL) {
			cset_set_format(cset, code);
			break;
		}
		/* Suppose it indicates alias such as ".tgz". */
		code = decompose_alias(p);
		if (code == NULL)
			break;
		/* Replace the suffix. */
		*p = '\0';
		name = realloc(name, strlen(name) + strlen(code) + 1);
		if (name == NULL)
			lafe_errc(1, 0, "No memory");
		strcat(name, code);
	}
	free(name);
	if (cset->filters) {
		struct filter_set *v;
		int i, r;

		/* Release previous filters. */
		_cleanup_filters(old_filters, old_filter_count);

		v = malloc(sizeof(*v) * cset->filter_count);
		if (v == NULL)
			lafe_errc(1, 0, "No memory");
		/* Reverse filter sequence. */
		for (i = 0, r = cset->filter_count; r > 0; )
			v[i++] = cset->filters[--r];
		free(cset->filters);
		cset->filters = v;
		return (1);
	} else {
		/* Put previous filters back. */
		cset->filters = old_filters;
		cset->filter_count = old_filter_count;
		return (0);
	}
}